

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EstimatorUtilStats.h
# Opt level: O0

void WriteHeaderInOutput(FILE *f,Parameters *params,CGraph *cg,Count triangle_count)

{
  uint uVar1;
  VertexIdx VVar2;
  value_type vVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char *pcVar6;
  reference pvVar7;
  EdgeIdx EVar8;
  char *pcVar9;
  char *pcVar10;
  Count triangle_count_local;
  CGraph *cg_local;
  Parameters *params_local;
  FILE *f_local;
  
  uVar4 = std::__cxx11::string::c_str();
  uVar5 = std::__cxx11::string::c_str();
  pcVar9 = "false";
  if ((params->normalization_count_available & 1U) != 0) {
    pcVar9 = "true";
  }
  pcVar10 = "false";
  if ((params->CSS & 1U) != 0) {
    pcVar10 = "true";
  }
  pcVar6 = "false";
  if ((params->NB & 1U) != 0) {
    pcVar6 = "true";
  }
  fprintf((FILE *)f,"#Filename = %s , Algo name = %s, edge count available=%s, CSS = %s, NB=%s \n",
          uVar4,uVar5,pcVar9,pcVar10,pcVar6);
  fprintf((FILE *)f,"########################\n");
  uVar4 = std::__cxx11::string::c_str();
  fprintf((FILE *)f,"#Algorithm : %s\n",uVar4);
  fprintf((FILE *)f,"########################\n");
  fprintf((FILE *)f,"vertices,edges,triangles\n");
  fprintf((FILE *)f,"%lld,%lld,%lld\n",cg->nVertices,cg->nEdges,triangle_count);
  fprintf((FILE *)f,
          "no_of_repeat,seed_count,seed_vertex,degree_of_seed_vertex,walk_length,subsample_size,sparsification_prob\n"
         );
  uVar1 = params->no_of_repeat;
  VVar2 = params->seed_count;
  pvVar7 = std::vector<long,_std::allocator<long>_>::operator[](&params->seed_vertices,0);
  vVar3 = *pvVar7;
  pvVar7 = std::vector<long,_std::allocator<long>_>::operator[](&params->seed_vertices,0);
  EVar8 = Escape::CGraph::degree(cg,*pvVar7);
  fprintf((FILE *)f,"%d,%lld,%lld,%lld,%lld,%lld,%lf\n",params->sparsification_prob,(ulong)uVar1,
          VVar2,vVar3,EVar8,params->walk_length,params->subsample_size);
  return;
}

Assistant:

void WriteHeaderInOutput(FILE *f, Parameters params, CGraph *cg, Count triangle_count) {
    fprintf(f, "#Filename = %s , Algo name = %s, "
               "edge count available=%s, CSS = %s, NB=%s \n",
            params.filename.c_str(), params.algo_name.c_str(),
            params.normalization_count_available ? "true":"false",
            params.CSS ? "true":"false",
            params.NB ? "true":"false");
    fprintf(f, "########################\n");
    fprintf(f, "#Algorithm : %s\n",params.algo_name.c_str());
    fprintf(f, "########################\n");
    fprintf(f, "vertices,edges,triangles\n");
    fprintf(f, "%lld,%lld,%lld\n", cg->nVertices, cg->nEdges, triangle_count);
    fprintf(f, "no_of_repeat,seed_count,seed_vertex,degree_of_seed_vertex,"
               "walk_length,subsample_size,sparsification_prob\n");
    fprintf(f, "%d,%lld,%lld,%lld,%lld,%lld,%lf\n",params.no_of_repeat, params.seed_count, params.seed_vertices[0],
            cg->degree(params.seed_vertices[0]),params.walk_length,
            params.subsample_size, params.sparsification_prob);

}